

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastErS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 uVar1;
  char *pcVar2;
  ushort *puVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (data.field_0._0_2_ != 0) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar1 = *(undefined8 *)
           ((long)&table->has_bits_offset +
           ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar8 = (ulong)ptr[2];
  if ((long)uVar8 < 0) {
    uVar5 = (long)ptr[3] << 7 | 0x7f;
    if ((long)uVar5 < 0) {
      uVar9 = (long)ptr[4] << 0xe | 0x3fff;
      if ((long)uVar9 < 0) {
        uVar5 = uVar5 & ((long)ptr[5] << 0x15 | 0x1fffffU);
        if ((long)uVar5 < 0) {
          uVar9 = uVar9 & ((long)ptr[6] << 0x1c | 0xfffffffU);
          if ((long)uVar9 < 0) {
            uVar5 = uVar5 & ((long)ptr[7] << 0x23 | 0x7ffffffffU);
            if ((long)uVar5 < 0) {
              uVar9 = uVar9 & ((long)ptr[8] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar9 < 0) {
                uVar5 = uVar5 & ((long)ptr[9] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar5 < 0) {
                  uVar9 = uVar9 & ((ulong)(byte)ptr[10] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar9 < 0) {
                    puVar3 = (ushort *)(ptr + 0xc);
                    if ((ptr[0xb] != '\x01') && (ptr[0xb] < '\0')) {
                      puVar3 = (ushort *)0x0;
                      goto LAB_00296c54;
                    }
                  }
                  else {
                    puVar3 = (ushort *)(ptr + 0xb);
                  }
                }
                else {
                  puVar3 = (ushort *)(ptr + 10);
                }
              }
              else {
                puVar3 = (ushort *)(ptr + 9);
              }
            }
            else {
              puVar3 = (ushort *)(ptr + 8);
            }
          }
          else {
            puVar3 = (ushort *)(ptr + 7);
          }
        }
        else {
          puVar3 = (ushort *)(ptr + 6);
        }
      }
      else {
        puVar3 = (ushort *)(ptr + 5);
      }
      uVar5 = uVar5 & uVar9;
    }
    else {
      puVar3 = (ushort *)(ptr + 4);
    }
    uVar8 = uVar8 & uVar5;
  }
  else {
    puVar3 = (ushort *)(ptr + 3);
  }
LAB_00296c54:
  if (puVar3 == (ushort *)0x0) {
    pcVar2 = Error(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  iVar4 = (int)(short)uVar1;
  uVar6 = (uint)uVar8;
  if (((int)uVar6 < iVar4) || ((int)(iVar4 + ((uint)((ulong)uVar1 >> 0x10) & 0xffff)) <= (int)uVar6)
     ) {
    pcVar2 = FastUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  puVar7 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar7 & 3) == 0) {
    *puVar7 = uVar6;
    if (puVar3 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar6 = (uint)table->fast_idx_mask & (uint)*puVar3;
      if ((uVar6 & 7) == 0) {
        uVar8 = (ulong)(uVar6 & 0xfffffff8);
        pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                   (msg,puVar3,ctx,
                                    (ulong)*puVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2)
                                   );
        return pcVar2;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar7 & 3) != 0) goto LAB_00296d6e;
      *puVar7 = *puVar7 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
    }
    return (char *)puVar3;
  }
LAB_00296d6e:
  AlignFail(puVar7);
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE const char* TcParser::SingularEnum(
    PROTOBUF_TC_PARAM_DECL) {
  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  const TcParseTableBase::FieldAux aux = *table->field_aux(data.aux_idx());
  PrefetchEnumData(xform_val, aux);
  const char* ptr2 = ptr;  // Save for unknown enum case
  ptr += sizeof(TagType);  // Consume tag
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  if (PROTOBUF_PREDICT_FALSE(
          !EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux))) {
    ptr = ptr2;
    PROTOBUF_MUSTTAIL return FastUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
  }
  hasbits |= (uint64_t{1} << data.hasbit_idx());
  RefAt<int32_t>(msg, data.offset()) = tmp;
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}